

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::Visibility> *enum_handler,Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *result,
               string *warn,string *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  optional<tinyusdz::Interpolation> oVar4;
  undefined1 uVar5;
  vtable_type *pvVar6;
  undefined8 this;
  bool bVar7;
  uint32_t uVar8;
  ostream *poVar9;
  long *plVar10;
  long lVar11;
  anon_struct_8_0_00000001_for___align *paVar12;
  Attribute *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_struct_8_0_00000001_for___align aVar14;
  char *pcVar15;
  bool bVar16;
  undefined7 in_register_00000031;
  char *pcVar17;
  ulong uVar18;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *args_1;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *__return_storage_ptr__;
  string *args_2;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  optional<tinyusdz::Token> tok;
  ostringstream ss_e;
  string local_2c8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  bool local_258;
  undefined1 local_250 [40];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  undefined1 uStack_208;
  char local_1fc;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1f8;
  double local_1c8;
  storage_t<double> local_1c0;
  anon_struct_8_0_00000001_for___align local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [24];
  undefined1 local_190 [8];
  storage_t<tinyusdz::Token> asStack_188 [2];
  ios_base local_138 [264];
  
  local_298._24_8_ = prop_name;
  if (result == (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x69b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"[Internal error] `result` arg is nullptr.",0x29);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_00254c81;
    ::std::__cxx11::stringbuf::str();
    plVar10 = (long *)::std::__cxx11::string::_M_append(local_2a8,(ulong)(err->_M_dataplus)._M_p);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar13) {
      aStack_218._M_local_buf[0] = (char)paVar13->_M_allocated_capacity;
      aStack_218._M_allocated_capacity._1_7_ = (undefined7)(paVar13->_M_allocated_capacity >> 8);
      aStack_218._M_local_buf[8] = (char)plVar10[3];
      aStack_218._9_7_ = (undefined7)((ulong)plVar10[3] >> 8);
      local_228._0_8_ = &aStack_218;
    }
    else {
      aStack_218._M_local_buf[0] = (char)paVar13->_M_allocated_capacity;
      aStack_218._M_allocated_capacity._1_7_ = (undefined7)(paVar13->_M_allocated_capacity >> 8);
      local_228._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar10;
    }
    local_228._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar10 + 1);
    *plVar10 = (long)paVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &aStack_218) {
      operator_delete((void *)local_228._0_8_,
                      CONCAT71(aStack_218._M_allocated_capacity._1_7_,aStack_218._M_local_buf[0]) +
                      1);
    }
    if ((undefined1 *)local_2a8._0_8_ == local_298) goto LAB_00254c81;
  }
  else {
    _local_1fc = (undefined4)CONCAT71(in_register_00000031,strict_allowedToken_check);
    args = attr;
    args_1 = result;
    args_2 = warn;
    local_1f8._32_8_ = enum_handler;
    bVar7 = Attribute::is_connection(attr);
    if (!bVar7) {
      if (attr->_variability == Uniform) {
        if ((attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar6 = (attr->_var)._value.v_.vtable;
          if (pvVar6 == (vtable_type *)0x0) {
            bVar7 = false;
          }
          else {
            uVar8 = (*pvVar6->type_id)();
            bVar7 = uVar8 == 4;
          }
          if ((bVar7) || (((attr->_var)._blocked & 1U) != 0)) {
            result->_blocked = true;
            return true;
          }
        }
        bVar7 = primvar::PrimVar::is_timesamples(&attr->_var);
        if (bVar7) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar9 = (ostream *)
                   ::std::ostream::operator<<((optional<tinyusdz::Token> *)local_1a8,0x6ac);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          pcVar17 = 
          "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.";
          pcVar15 = "";
          goto LAB_0025499e;
        }
        Attribute::get_value<tinyusdz::Token>((optional<tinyusdz::Token> *)local_1a8,attr);
        local_228[0] = local_1a8[0];
        if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
          local_228._8_8_ = (long)aStack_218._M_local_buf + 8;
          if ((undefined1 *)local_1a8._8_8_ == local_190) {
            uStack_208 = asStack_188[0]._0_1_;
          }
          else {
            local_228._8_8_ = local_1a8._8_8_;
          }
          aStack_218._9_7_ = local_190._1_7_;
          aStack_218._M_local_buf[8] = local_190[0];
          aStack_218._M_local_buf[0] = local_1a8[0x10];
          aStack_218._M_allocated_capacity._1_7_ = local_1a8._17_7_;
          local_1a8[0x10] = '\0';
          local_1a8._17_7_ = 0;
          local_190[0] = '\0';
          local_1a8._8_8_ = local_190;
        }
        if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
          if (*(long *)(local_1f8._32_8_ + 0x10) == 0) goto LAB_00256a63;
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_228 + 8);
          (**(code **)(local_1f8._32_8_ + 0x18))
                    ((expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2a8,(_Any_data *)local_1f8._32_8_,pbVar1);
          if (local_298[0x10] == '\x01') {
            local_1a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1a8[0x10] = '\0';
            local_1a8._17_7_ = 0;
            local_190[0] = '\0';
            local_190._1_7_ = 0;
            asStack_188[0]._0_1_ = 0;
            local_1a8._0_4_ = local_2a8._0_4_;
            local_1a8._4_2_ = 1;
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>>::operator=
                      ((optional<tinyusdz::Animatable<tinyusdz::Visibility>> *)&result->_attrib,
                       (Animatable<tinyusdz::Visibility> *)local_1a8);
            if ((anon_struct_8_0_00000001_for___align)local_1a8._8_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              operator_delete((void *)local_1a8._8_8_,
                              CONCAT71(local_190._1_7_,local_190[0]) - local_1a8._8_8_);
            }
LAB_00256a0c:
            bVar16 = true;
          }
          else {
            if (local_1fc == '\0') {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6b7);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2c8,
                         "Attribute `{}`: `{}` is not an allowed token. Ignore it.","");
              if ((string)local_228[0] == (string)0x0) goto LAB_00256a68;
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)local_278,(fmt *)&local_2c8,(string *)local_298._24_8_,pbVar1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if (warn != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_278,&local_2c8,err);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_278);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              result->_empty = true;
              goto LAB_00256a0c;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6b5);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            paVar3 = &local_2c8.field_2;
            local_2c8._M_dataplus._M_p = (pointer)paVar3;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,"Attribute `{}`: `{}` is not an allowed token.","");
            if ((string)local_228[0] == (string)0x0) goto LAB_00256a68;
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_278,(fmt *)&local_2c8,(string *)local_298._24_8_,pbVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != paVar3) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_278,&local_2c8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_278);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar16 = false;
          }
          if ((local_298[0x10] == '\0') && ((undefined1 *)local_2a8._0_8_ != local_298)) {
            operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6bc);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          _Var2._M_p = local_278 + 0x10;
          local_278._0_8_ = _Var2._M_p;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,
                     "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                     ,"");
          Attribute::type_name_abi_cxx11_(&local_2c8,attr);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_2a8,(fmt *)local_278,(string *)local_298._24_8_,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_2a8._0_8_,local_2a8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((undefined1 *)local_2a8._0_8_ != local_298) {
            operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_278._0_8_ != _Var2._M_p) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_278,err);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_2a8);
            if ((undefined1 *)local_2a8._0_8_ != local_298) {
              operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
            }
            if ((pointer)local_278._0_8_ != _Var2._M_p) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          bVar16 = false;
        }
        if ((string)local_228[0] != (string)0x1) {
          return bVar16;
        }
        if (local_228._8_8_ == (long)aStack_218._M_local_buf + 8) {
          return bVar16;
        }
        uVar18 = CONCAT71(aStack_218._9_7_,aStack_218._M_local_buf[8]) + 1;
        goto LAB_00256398;
      }
      local_228._0_8_ = local_228._0_8_ & 0xffff000000000000;
      local_228._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      aStack_218._M_local_buf[0] = '\0';
      aStack_218._M_allocated_capacity._1_7_ = 0;
      aStack_218._M_local_buf[8] = '\0';
      aStack_218._9_7_ = 0;
      uStack_208 = 0;
      if ((attr->_var)._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (attr->_var)._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar6 = (attr->_var)._value.v_.vtable;
        if (pvVar6 == (vtable_type *)0x0) {
          uVar18 = 0;
          bVar7 = false;
        }
        else {
          uVar8 = (*pvVar6->type_id)();
          bVar7 = uVar8 == 4;
          uVar18 = (ulong)CONCAT31((int3)(uVar8 >> 8),bVar7);
        }
        if ((!bVar7) && (((attr->_var)._blocked & 1U) == 0)) goto LAB_00254e6a;
        result->_blocked = true;
        local_250._36_4_ = (undefined4)CONCAT71((int7)(uVar18 >> 8),1);
      }
      else {
LAB_00254e6a:
        local_250._36_4_ = 0;
      }
      local_1f8._24_8_ = warn;
      if (((attr->_var)._blocked == false) &&
         (((pvVar6 = (attr->_var)._value.v_.vtable, pvVar6 != (vtable_type *)0x0 &&
           (uVar8 = (*pvVar6->type_id)(), uVar8 == 0)) ||
          ((pvVar6 = (attr->_var)._value.v_.vtable, pvVar6 != (vtable_type *)0x0 &&
           (uVar8 = (*pvVar6->type_id)(), uVar8 == 1)))))) {
LAB_00255600:
        lVar11 = (long)(attr->_var)._ts._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(attr->_var)._ts._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar11 == 0) {
          bVar7 = false;
        }
        else {
          local_1f8._40_8_ = &attr->_var;
          aVar14 = (anon_struct_8_0_00000001_for___align)((lVar11 >> 3) * -0x3333333333333333);
          local_1f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          _Var2._M_p = local_278 + 0x10;
          local_1f8._20_4_ = SUB84(&local_1f8,0);
          local_1f8._8_8_ = result;
          local_1c0 = (storage_t<double>)attr;
          local_1b8 = aVar14;
          do {
            primvar::PrimVar::get_ts_time
                      ((optional<double> *)local_1a8,(PrimVar *)local_1f8._40_8_,
                       (size_t)local_1f8.data._0_8_);
            uVar5 = local_1a8[0];
            if ((ostringstream)local_1a8[0] != (ostringstream)0x0) {
              uVar20 = (undefined4)local_1a8._8_8_;
              uVar21 = SUB84(local_1a8._8_8_,4);
            }
            else {
              uVar20 = local_1b0._0_4_;
              uVar21 = local_1b0._4_4_;
            }
            local_1b0._4_4_ = uVar21;
            local_1b0._0_4_ = uVar20;
            if ((ostringstream)local_1a8[0] == (ostringstream)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x6ef);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              local_278._0_8_ = _Var2._M_p;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_278,"Internal error. Failed to get timecode for `{}`","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_2a8,(fmt *)local_278,(string *)local_298._24_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aVar14
                        );
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_2a8._0_8_,local_2a8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((undefined1 *)local_2a8._0_8_ != local_298) {
                operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
              }
              if ((pointer)local_278._0_8_ != _Var2._M_p) {
                operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                paVar12 = (anon_struct_8_0_00000001_for___align *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)local_278,(ulong)(err->_M_dataplus)._M_p);
                aVar14 = (anon_struct_8_0_00000001_for___align)(paVar12 + 2);
                if ((anon_struct_8_0_00000001_for___align)*(pointer *)paVar12 == aVar14) {
                  local_298._0_8_ = *(undefined8 *)aVar14;
                  local_298._8_8_ = paVar12[3];
                  local_2a8._0_8_ = local_298;
                }
                else {
                  local_298._0_8_ = *(undefined8 *)aVar14;
                  local_2a8._0_8_ = *(pointer *)paVar12;
                }
                local_2a8._8_8_ = paVar12[1];
                *paVar12 = aVar14;
                paVar12[1] = (anon_struct_8_0_00000001_for___align)0x0;
                *(undefined1 *)(paVar12 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_2a8);
                if ((undefined1 *)local_2a8._0_8_ != local_298) {
                  operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
                }
                if ((pointer)local_278._0_8_ != _Var2._M_p) {
                  operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              uVar20 = 0;
              uVar21 = 0x7ff80000;
            }
            iVar19 = 1;
            if ((ostringstream)uVar5 != (ostringstream)0x0) {
              local_1c8 = (double)CONCAT44(uVar21,uVar20);
              primvar::PrimVar::is_ts_value_blocked((PrimVar *)local_1a8,local_1f8._40_8_);
              aVar14._1_7_ = 0;
              aVar14._0_1_ = local_1f8._20_1_;
              uVar5 = local_1a8[1];
              if ((ostringstream)local_1a8[0] == (ostringstream)0x0) {
                uVar5 = local_1f8._20_1_;
              }
              local_1f8._20_4_ = ZEXT14((byte)uVar5);
              if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
                if ((uVar5 & 1) != 0) {
                  TypedTimeSamples<tinyusdz::Visibility>::add_blocked_sample
                            ((TypedTimeSamples<tinyusdz::Visibility> *)(local_228 + 8),local_1c8);
                  iVar19 = 0x16;
                  goto LAB_00255b2f;
                }
                iVar19 = 0;
                bVar7 = true;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x6f9);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                local_278._0_8_ = _Var2._M_p;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,
                           "Internal error. Failed to get valueblock info for `{}`","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_2a8,(fmt *)local_278,(string *)local_298._24_8_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           aVar14);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)local_2a8._0_8_,local_2a8._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                if ((undefined1 *)local_2a8._0_8_ != local_298) {
                  operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
                }
                if ((pointer)local_278._0_8_ != _Var2._M_p) {
                  operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  paVar12 = (anon_struct_8_0_00000001_for___align *)
                            ::std::__cxx11::string::_M_append
                                      (local_278,(ulong)(err->_M_dataplus)._M_p);
                  aVar14 = (anon_struct_8_0_00000001_for___align)(paVar12 + 2);
                  if ((anon_struct_8_0_00000001_for___align)*(pointer *)paVar12 == aVar14) {
                    local_298._0_8_ = *(undefined8 *)aVar14;
                    local_298._8_8_ = paVar12[3];
                    local_2a8._0_8_ = local_298;
                  }
                  else {
                    local_298._0_8_ = *(undefined8 *)aVar14;
                    local_2a8._0_8_ = *(pointer *)paVar12;
                  }
                  local_2a8._8_8_ = paVar12[1];
                  *paVar12 = aVar14;
                  paVar12[1] = (anon_struct_8_0_00000001_for___align)0x0;
                  *(undefined1 *)(paVar12 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_2a8);
                  if ((undefined1 *)local_2a8._0_8_ != local_298) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
                  }
                  if ((pointer)local_278._0_8_ != _Var2._M_p) {
                    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                iVar19 = 1;
LAB_00255b2f:
                bVar7 = false;
              }
              __return_storage_ptr__ =
                   (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                   local_250;
              if (bVar7) {
                primvar::PrimVar::get_ts_value<tinyusdz::Token>
                          ((optional<tinyusdz::Token> *)local_1a8,(PrimVar *)local_1f8._40_8_,
                           (size_t)local_1f8.data._0_8_);
                local_2a8[0] = local_1a8[0];
                paVar3 = &local_2c8.field_2;
                if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
                  local_2a8._8_8_ = (long)local_298 + 8;
                  if ((undefined1 *)local_1a8._8_8_ != local_190) {
                    local_2a8._8_8_ = local_1a8._8_8_;
                  }
                  local_298._9_7_ = local_190._1_7_;
                  local_298[8] = local_190[0];
                  aVar14._1_7_ = local_1a8._17_7_;
                  aVar14._0_1_ = local_1a8[0x10];
                  local_1a8[0x10] = '\0';
                  local_1a8._17_7_ = 0;
                  local_190[0] = '\0';
                  local_298._0_8_ = aVar14;
                  local_1a8._8_8_ = local_190;
                }
                if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
                  if (*(long *)(local_1f8._32_8_ + 0x10) == 0) goto LAB_00256a63;
                  (**(code **)(local_1f8._32_8_ + 0x18))
                            ((expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_278,(_Any_data *)local_1f8._32_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_2a8 + 8));
                  if (local_258 == true) {
                    TypedTimeSamples<tinyusdz::Visibility>::add_sample
                              ((TypedTimeSamples<tinyusdz::Visibility> *)(local_228 + 8),local_1c8,
                               (Visibility *)local_278);
                    iVar19 = 0;
                  }
                  else if (local_1fc == '\0') {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar9 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x703);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                    local_250._0_8_ = (long)local_250 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,
                               "Attribute `{}`: `{}` at {}\'th timesample is not an allowed token. Ignore it."
                               ,"");
                    if ((fmt)local_2a8[0] == (fmt)0x0) goto LAB_00256a68;
                    aVar14 = (anon_struct_8_0_00000001_for___align)&local_1f8;
                    args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>
                              *)(local_2a8 + 8);
                    fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                              (&local_2c8,(fmt *)__return_storage_ptr__,(string *)local_298._24_8_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               aVar14,(unsigned_long *)args_1,args_2);
                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1a8,local_2c8._M_dataplus._M_p,
                                        local_2c8._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_250._0_8_ != (long)local_250 + 0x10) {
                      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                    }
                    if ((string *)local_1f8._24_8_ != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      paVar12 = (anon_struct_8_0_00000001_for___align *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)__return_storage_ptr__,
                                           (ulong)(err->_M_dataplus)._M_p);
                      aVar14 = (anon_struct_8_0_00000001_for___align)(paVar12 + 2);
                      if (*paVar12 == aVar14) {
                        local_2c8.field_2._M_allocated_capacity = *(undefined8 *)aVar14;
                        local_2c8.field_2._8_8_ = paVar12[3];
                        local_2c8._M_dataplus._M_p = (pointer)paVar3;
                      }
                      else {
                        local_2c8.field_2._M_allocated_capacity = *(undefined8 *)aVar14;
                        local_2c8._M_dataplus._M_p = (pointer)*paVar12;
                      }
                      local_2c8._M_string_length = *(size_type *)(paVar12 + 1);
                      *paVar12 = aVar14;
                      paVar12[1] = (anon_struct_8_0_00000001_for___align)0x0;
                      *(undefined1 *)(paVar12 + 2) = 0;
                      ::std::__cxx11::string::operator=
                                ((string *)local_1f8._24_8_,(string *)&local_2c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2c8._M_dataplus._M_p != paVar3) {
                        operator_delete(local_2c8._M_dataplus._M_p,
                                        local_2c8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_250._0_8_ != (long)local_250 + 0x10) {
                        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    iVar19 = 0x16;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar9 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x701);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                    local_250._0_8_ = (long)local_250 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,
                               "Attribute `{}`: `{}` is not an allowed token.","");
                    if ((fmt)local_2a8[0] == (fmt)0x0) goto LAB_00256a68;
                    aVar14 = (anon_struct_8_0_00000001_for___align)((long)local_2a8 + 8);
                    fmt::format<std::__cxx11::string,std::__cxx11::string>
                              (&local_2c8,(fmt *)__return_storage_ptr__,(string *)local_298._24_8_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               aVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)args_1);
                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1a8,local_2c8._M_dataplus._M_p,
                                        local_2c8._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_250._0_8_ != (long)local_250 + 0x10) {
                      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                    }
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      paVar12 = (anon_struct_8_0_00000001_for___align *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)__return_storage_ptr__,
                                           (ulong)(err->_M_dataplus)._M_p);
                      aVar14 = (anon_struct_8_0_00000001_for___align)(paVar12 + 2);
                      if (*paVar12 == aVar14) {
                        local_2c8.field_2._M_allocated_capacity = *(undefined8 *)aVar14;
                        local_2c8.field_2._8_8_ = paVar12[3];
                        local_2c8._M_dataplus._M_p = (pointer)paVar3;
                      }
                      else {
                        local_2c8.field_2._M_allocated_capacity = *(undefined8 *)aVar14;
                        local_2c8._M_dataplus._M_p = (pointer)*paVar12;
                      }
                      local_2c8._M_string_length = *(size_type *)(paVar12 + 1);
                      *paVar12 = aVar14;
                      paVar12[1] = (anon_struct_8_0_00000001_for___align)0x0;
                      *(undefined1 *)(paVar12 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)err,(string *)&local_2c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2c8._M_dataplus._M_p != paVar3) {
                        operator_delete(local_2c8._M_dataplus._M_p,
                                        local_2c8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_250._0_8_ != (long)local_250 + 0x10) {
                        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    iVar19 = 1;
                  }
                  if ((local_258 == false) && ((pointer)local_278._0_8_ != _Var2._M_p)) {
                    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar9 = (ostream *)::std::ostream::operator<<((PrimVar *)local_1a8,0x707);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  local_2c8._M_dataplus._M_p = (pointer)paVar3;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2c8,
                             "Internal error. Maybe type mismatch? Attribute `{}`\'s {}\'th timesample must be type `token`, but got type `{}`"
                             ,"");
                  Attribute::type_name_abi_cxx11_
                            ((string *)__return_storage_ptr__,(Attribute *)local_1c0);
                  aVar14 = (anon_struct_8_0_00000001_for___align)&local_1f8;
                  fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                            ((string *)local_278,(fmt *)&local_2c8,(string *)local_298._24_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             aVar14,(unsigned_long *)__return_storage_ptr__,args_2);
                  poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  args_1 = __return_storage_ptr__;
                  if ((pointer)local_278._0_8_ != _Var2._M_p) {
                    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                    args_1 = __return_storage_ptr__;
                  }
                  if (local_250._0_8_ != (long)local_250 + 0x10) {
                    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar3) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    paVar12 = (anon_struct_8_0_00000001_for___align *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_2c8,(ulong)(err->_M_dataplus)._M_p);
                    aVar14 = (anon_struct_8_0_00000001_for___align)(paVar12 + 2);
                    if ((anon_struct_8_0_00000001_for___align)*(pointer *)paVar12 == aVar14) {
                      local_278._16_8_ = *(undefined8 *)aVar14;
                      local_278._24_8_ = paVar12[3];
                      local_278._0_8_ = _Var2._M_p;
                    }
                    else {
                      local_278._16_8_ = *(undefined8 *)aVar14;
                      local_278._0_8_ = *(pointer *)paVar12;
                    }
                    local_278._8_8_ = paVar12[1];
                    *paVar12 = aVar14;
                    paVar12[1] = (anon_struct_8_0_00000001_for___align)0x0;
                    *(undefined1 *)(paVar12 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_278);
                    if ((pointer)local_278._0_8_ != _Var2._M_p) {
                      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                  iVar19 = 1;
                }
                if (((fmt)local_2a8[0] == (fmt)0x1) && (local_2a8._8_8_ != (long)local_298 + 8)) {
                  operator_delete((void *)local_2a8._8_8_,local_298._8_8_ + 1);
                }
              }
            }
            if ((iVar19 != 0x16) && (iVar19 != 0)) goto LAB_00256332;
            local_1f8.data._0_8_ = (undefined8)((long)local_1f8.data._0_8_ + 1);
          } while ((ulong)local_1f8.data._0_8_ < (ulong)local_1b8);
          iVar19 = 0x14;
LAB_00256332:
          bVar7 = iVar19 == 0x14;
          result = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                   local_1f8._8_8_;
          if ((!bVar7) && (iVar19 != 0)) goto LAB_00256348;
        }
        bVar16 = true;
        if ((bVar7 | local_250[0x24]) == 1) {
          nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>>::operator=
                    ((optional<tinyusdz::Animatable<tinyusdz::Visibility>> *)&result->_attrib,
                     (Animatable<tinyusdz::Visibility> *)local_228);
        }
      }
      else {
        Attribute::get_value<tinyusdz::Token>((optional<tinyusdz::Token> *)local_1a8,attr);
        local_2a8[0] = local_1a8[0];
        if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
          local_2a8._8_8_ = (long)local_298 + 8;
          if ((undefined1 *)local_1a8._8_8_ != local_190) {
            local_2a8._8_8_ = local_1a8._8_8_;
          }
          local_298._9_7_ = local_190._1_7_;
          local_298[8] = local_190[0];
          local_298._1_7_ = local_1a8._17_7_;
          local_298[0] = local_1a8[0x10];
          local_1a8[0x10] = '\0';
          local_1a8._17_7_ = 0;
          local_190[0] = '\0';
          local_1a8._8_8_ = local_190;
        }
        if ((ostringstream)local_1a8[0] == (ostringstream)0x1) {
          if (*(long *)(local_1f8._32_8_ + 0x10) == 0) {
LAB_00256a63:
            ::std::__throw_bad_function_call();
          }
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a8 + 8);
          (**(code **)(local_1f8._32_8_ + 0x18))
                    ((expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_278,(_Any_data *)local_1f8._32_8_,pbVar1);
          if (local_258 == true) {
            local_228._4_2_ = 1;
            local_228._0_4_ = local_278._0_4_;
            bVar7 = true;
            local_250._36_4_ = (undefined4)CONCAT71((uint7)SUB83(local_278._0_8_,1),1);
          }
          else {
            local_1f8._8_8_ = result;
            if (local_1fc == '\0') {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6da);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              local_250._0_8_ = (long)local_250 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_250,
                         "Attribute `{}`: `{}` is not an allowed token. Ignore it.","");
              if ((fmt)local_2a8[0] == (fmt)0x0) goto LAB_00256a68;
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_2c8,(fmt *)local_250,(string *)local_298._24_8_,pbVar1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2c8._M_dataplus._M_p,
                                  local_2c8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              this = local_1f8._24_8_;
              if (local_250._0_8_ != (long)local_250 + 0x10) {
                operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
              }
              if ((string *)this != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_2c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,err);
                ::std::__cxx11::string::operator=((string *)this,(string *)&local_2c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                if (local_250._0_8_ != (long)local_250 + 0x10) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              bVar7 = true;
              result = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                       local_1f8._8_8_;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6d8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              oVar4 = (optional<tinyusdz::Interpolation>)((long)local_250 + 0x10);
              local_250._0_8_ = oVar4;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_250,"Attribute `{}`: `{}` is not an allowed token.","");
              if ((fmt)local_2a8[0] == (fmt)0x0) {
LAB_00256a68:
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x591,
                              "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                             );
              }
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_2c8,(fmt *)local_250,(string *)local_298._24_8_,pbVar1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2c8._M_dataplus._M_p,
                                  local_2c8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((optional<tinyusdz::Interpolation>)local_250._0_8_ != oVar4) {
                operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_2c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_2c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                if ((optional<tinyusdz::Interpolation>)local_250._0_8_ != oVar4) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              bVar7 = false;
              result = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                       local_1f8._8_8_;
            }
          }
          if ((local_258 == false) && ((undefined1 *)local_278._0_8_ != local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x6df);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,
                     "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                     ,"");
          Attribute::type_name_abi_cxx11_((string *)local_250,attr);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_278,(fmt *)&local_2c8,(string *)local_298._24_8_,
                     (string *)local_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          _Var2._M_p = local_278 + 0x10;
          if ((pointer)local_278._0_8_ != _Var2._M_p) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if (local_250._0_8_ != (long)local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            paVar12 = (anon_struct_8_0_00000001_for___align *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_2c8,(ulong)(err->_M_dataplus)._M_p);
            aVar14 = (anon_struct_8_0_00000001_for___align)(paVar12 + 2);
            if ((anon_struct_8_0_00000001_for___align)*(pointer *)paVar12 == aVar14) {
              local_278._16_8_ = *(undefined8 *)aVar14;
              local_278._24_8_ = paVar12[3];
              local_278._0_8_ = _Var2._M_p;
            }
            else {
              local_278._16_8_ = *(undefined8 *)aVar14;
              local_278._0_8_ = *(pointer *)paVar12;
            }
            local_278._8_8_ = paVar12[1];
            *paVar12 = aVar14;
            paVar12[1] = (anon_struct_8_0_00000001_for___align)0x0;
            *(undefined1 *)(paVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_278);
            if ((pointer)local_278._0_8_ != _Var2._M_p) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          bVar7 = false;
        }
        if (((fmt)local_2a8[0] == (fmt)0x1) && (local_2a8._8_8_ != (long)local_298 + 8)) {
          operator_delete((void *)local_2a8._8_8_,local_298._8_8_ + 1);
        }
        if (bVar7) goto LAB_00255600;
LAB_00256348:
        bVar16 = false;
      }
      if ((anon_struct_8_0_00000001_for___align)local_228._8_8_ ==
          (anon_struct_8_0_00000001_for___align)0x0) {
        return bVar16;
      }
      uVar18 = CONCAT71(aStack_218._9_7_,aStack_218._M_local_buf[8]) - local_228._8_8_;
LAB_00256398:
      operator_delete((void *)local_228._8_8_,uVar18);
      return bVar16;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ParseTimeSampledEnumProperty",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x69f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    pcVar17 = 
    "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}";
    pcVar15 = "";
LAB_0025499e:
    local_2a8._0_8_ = local_298;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,pcVar17,pcVar15);
    fmt::format<std::__cxx11::string>
              ((string *)local_228,(fmt *)local_2a8,(string *)local_298._24_8_,&args->_name);
    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_228._0_8_,local_228._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &aStack_218) {
      operator_delete((void *)local_228._0_8_,
                      CONCAT71(aStack_218._M_allocated_capacity._1_7_,aStack_218._M_local_buf[0]) +
                      1);
    }
    if ((undefined1 *)local_2a8._0_8_ != local_298) {
      operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
    }
    if (err == (string *)0x0) goto LAB_00254c81;
    ::std::__cxx11::stringbuf::str();
    plVar10 = (long *)::std::__cxx11::string::_M_append(local_2a8,(ulong)(err->_M_dataplus)._M_p);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar13) {
      aStack_218._M_local_buf[0] = (char)paVar13->_M_allocated_capacity;
      aStack_218._M_allocated_capacity._1_7_ = (undefined7)(paVar13->_M_allocated_capacity >> 8);
      aStack_218._M_local_buf[8] = (char)plVar10[3];
      aStack_218._9_7_ = (undefined7)((ulong)plVar10[3] >> 8);
      local_228._0_8_ = &aStack_218;
    }
    else {
      aStack_218._M_local_buf[0] = (char)paVar13->_M_allocated_capacity;
      aStack_218._M_allocated_capacity._1_7_ = (undefined7)(paVar13->_M_allocated_capacity >> 8);
      local_228._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar10;
    }
    local_228._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar10 + 1);
    *plVar10 = (long)paVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &aStack_218) {
      operator_delete((void *)local_228._0_8_,
                      CONCAT71(aStack_218._M_allocated_capacity._1_7_,aStack_218._M_local_buf[0]) +
                      1);
    }
    if ((undefined1 *)local_2a8._0_8_ == local_298) goto LAB_00254c81;
  }
  operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._0_8_ + 1));
LAB_00254c81:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ParseTimeSampledEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<Animatable<T>> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // default and/or TimeSamples
    bool has_default{false};
    bool has_timesamples{false};

    Animatable<T> animatable_value;

    if (attr.is_blocked()) {
      result->set_blocked(true);
      has_default = true;
      //return true;
    }

    if (attr.get_var().has_default()) {
      DCOUT("has default.");

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          animatable_value.set_default(e.value());
          has_default = true;
          //return true;

        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          //result->set_value_empty();
          //return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    }

    if (attr.get_var().has_timesamples()) {
      DCOUT("has timesamples.");
      size_t n = attr.get_var().num_timesamples();

      for (size_t i = 0; i < n; i++) {

        double sample_time{value::TimeCode::Default()};

        if (auto pv = attr.get_var().get_ts_time(i)) {
          sample_time = pv.value();
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get timecode for `{}`", prop_name);
        }

        if (auto pv = attr.get_var().is_ts_value_blocked(i)) {
          if (pv.value() == true) {
            animatable_value.add_blocked_sample(sample_time);
            continue;
          }
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get valueblock info for `{}`", prop_name);
        }

        if (auto tok = attr.get_var().get_ts_value<value::token>(i)) {
          auto e = enum_handler(tok.value().str());
          if (e) {
            animatable_value.add_sample(sample_time, e.value());
          } else if (strict_allowedToken_check) {
            PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
          } else {
            PUSH_WARN_F("Attribute `{}`: `{}` at {}'th timesample is not an allowed token. Ignore it.", prop_name, i, tok.value().str());
            continue;
          }
        } else {
          PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}`'s {}'th timesample must be type `token`, but got type `{}`", prop_name, i, attr.type_name());
        }
      }

      has_timesamples = true;
      //return true;

    }

    if (has_default || has_timesamples) {
      result->set_value(animatable_value);
    }

    return true;

  }

  return false;
}